

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsSpreadsheetReportLayout.cpp
# Opt level: O3

void __thiscall
KDReports::SpreadsheetReportLayout::paintIcon
          (SpreadsheetReportLayout *this,QPainter *painter,QRectF *cellContentsRect,
          QVariant *cellDecoration)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  QMetaType QVar6;
  int iVar7;
  QPixmap *pQVar8;
  PrivateShared *pPVar9;
  double dVar10;
  QIcon t_1;
  QPixmap pix;
  QImage img;
  QMetaType in_stack_ffffffffffffff38;
  QIcon in_stack_ffffffffffffff40;
  undefined8 local_b0;
  QPixmap local_a8 [16];
  undefined8 local_98;
  QSize local_90 [2];
  undefined8 local_80;
  double local_78;
  code *local_70;
  double local_68;
  undefined8 local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  uVar1 = local_b0;
  bVar3 = operator==((QMetaType)in_stack_ffffffffffffff40.d,in_stack_ffffffffffffff38);
  if (bVar3) {
    pQVar8 = (QPixmap *)cellDecoration;
    if (((cellDecoration->d).field_0x18 & 1) != 0) {
      pPVar9 = (cellDecoration->d).data.shared;
      pQVar8 = (QPixmap *)(pPVar9 + *(int *)(pPVar9 + 4));
    }
    QPixmap::QPixmap(local_a8,pQVar8);
  }
  else {
    QPixmap::QPixmap(local_a8);
    QVar6.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    pPVar9 = (PrivateShared *)cellDecoration;
    if (((cellDecoration->d).field_0x18 & 1) != 0) {
      pPVar9 = (cellDecoration->d).data.shared;
      pPVar9 = pPVar9 + *(int *)(pPVar9 + 4);
    }
    QMetaType::convert(QVar6,pPVar9,(QMetaType)0x176010,local_a8);
  }
  cVar4 = QPixmap::isNull();
  if (cVar4 != '\0') {
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffff40.d,in_stack_ffffffffffffff38);
    if (bVar3) {
      pPVar9 = (PrivateShared *)cellDecoration;
      if (((cellDecoration->d).field_0x18 & 1) != 0) {
        pPVar9 = (cellDecoration->d).data.shared;
        pPVar9 = pPVar9 + *(int *)(pPVar9 + 4);
      }
      QIcon::QIcon((QIcon *)&stack0xffffffffffffff40,(QIcon *)pPVar9);
    }
    else {
      QIcon::QIcon((QIcon *)&stack0xffffffffffffff40);
      QVar6.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      pPVar9 = (PrivateShared *)cellDecoration;
      if (((cellDecoration->d).field_0x18 & 1) != 0) {
        pPVar9 = (cellDecoration->d).data.shared;
        pPVar9 = pPVar9 + *(int *)(pPVar9 + 4);
      }
      QMetaType::convert(QVar6,pPVar9,(QMetaType)0x175fa0,&stack0xffffffffffffff40);
    }
    QIcon::pixmap(local_90,(Mode)&stack0xffffffffffffff40,(int)this + 0x88);
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_70);
    uVar2 = local_80;
    local_60 = local_98;
    local_70 = QTextTableCell::firstCursorPosition;
    local_80 = 0;
    local_98 = uVar2;
    QPixmap::~QPixmap((QPixmap *)&local_70);
    QPixmap::~QPixmap((QPixmap *)local_90);
    QIcon::~QIcon((QIcon *)&stack0xffffffffffffff40);
  }
  iVar5 = QPixmap::height();
  QImage::QImage((QImage *)local_90);
  cVar4 = QPixmap::isNull();
  if (cVar4 != '\0') {
    bVar3 = operator==((QMetaType)in_stack_ffffffffffffff40.d,in_stack_ffffffffffffff38);
    if (bVar3) {
      if (((cellDecoration->d).field_0x18 & 1) != 0) {
        pPVar9 = (cellDecoration->d).data.shared;
        cellDecoration = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QImage::QImage((QImage *)&stack0xffffffffffffff40,(QImage *)cellDecoration);
    }
    else {
      QImage::QImage((QImage *)&stack0xffffffffffffff40);
      QVar6.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
      if (((cellDecoration->d).field_0x18 & 1) != 0) {
        pPVar9 = (cellDecoration->d).data.shared;
        cellDecoration = (QVariant *)(pPVar9 + *(int *)(pPVar9 + 4));
      }
      QMetaType::convert(QVar6,cellDecoration,(QMetaType)0x175f30,&stack0xffffffffffffff40);
    }
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_70);
    local_60 = local_80;
    local_70 = QTextCursor::blockFormat;
    local_b0 = 0;
    local_80 = uVar1;
    QImage::~QImage((QImage *)&local_70);
    QImage::~QImage((QImage *)&stack0xffffffffffffff40);
    cVar4 = QImage::isNull();
    if (cVar4 != '\0') goto LAB_00151fc5;
    iVar5 = QImage::height();
  }
  dVar10 = (this->m_tableLayout).m_cellFontScaler.m_scalingFactor;
  if ((dVar10 != 1.0) || (NAN(dVar10))) {
    cVar4 = QPixmap::isNull();
    if (cVar4 == '\0') {
      iVar5 = QPixmap::width();
      dVar10 = (double)iVar5 * (this->m_tableLayout).m_cellFontScaler.m_scalingFactor;
      QPixmap::scaledToWidth
                (&stack0xffffffffffffff40,local_a8,
                 (int)((double)((ulong)dVar10 & 0x8000000000000000 | (ulong)DAT_001569e0) + dVar10),
                 0);
      QPaintDevice::QPaintDevice((QPaintDevice *)&local_70);
      local_60 = local_98;
      local_70 = QTextTableCell::firstCursorPosition;
      local_98 = local_b0;
      QPixmap::~QPixmap((QPixmap *)&local_70);
      QPixmap::~QPixmap((QPixmap *)&stack0xffffffffffffff40);
      iVar5 = QPixmap::height();
    }
    else {
      iVar5 = QImage::width();
      dVar10 = (double)iVar5 * (this->m_tableLayout).m_cellFontScaler.m_scalingFactor;
      QImage::scaledToWidth
                (&stack0xffffffffffffff40,local_90,
                 (int)((double)((ulong)dVar10 & 0x8000000000000000 | (ulong)DAT_001569e0) + dVar10),
                 0);
      QPaintDevice::QPaintDevice((QPaintDevice *)&local_70);
      local_60 = local_80;
      local_70 = QTextCursor::blockFormat;
      local_80 = local_b0;
      QImage::~QImage((QImage *)&local_70);
      QImage::~QImage((QImage *)&stack0xffffffffffffff40);
      iVar5 = QImage::height();
    }
  }
  local_78 = cellContentsRect->h;
  local_48 = cellContentsRect->xp;
  uStack_40 = 0;
  local_58 = cellContentsRect->yp;
  uStack_50 = 0;
  cVar4 = QImage::isNull();
  iVar7 = (int)((local_78 - (double)iVar5) * 0.5);
  iVar5 = 0;
  if (0 < iVar7) {
    iVar5 = iVar7;
  }
  local_70 = (code *)(double)(int)((double)((ulong)local_48 & 0x8000000000000000 |
                                           0x3fe0000000000000) + local_48);
  local_68 = (double)((int)((double)((ulong)local_58 & 0x8000000000000000 | 0x3fe0000000000000) +
                           local_58) + iVar5);
  if (cVar4 == '\0') {
    QPainter::drawImage((QPointF *)painter,(QImage *)&local_70);
  }
  else {
    QPainter::drawPixmap((QPointF *)painter,(QPixmap *)&local_70);
  }
LAB_00151fc5:
  QImage::~QImage((QImage *)local_90);
  QPixmap::~QPixmap(local_a8);
  return;
}

Assistant:

void KDReports::SpreadsheetReportLayout::paintIcon(QPainter &painter, const QRectF &cellContentsRect, const QVariant &cellDecoration) const
{
    QPixmap pix = qvariant_cast<QPixmap>(cellDecoration);
    if (pix.isNull()) {
        pix = qvariant_cast<QIcon>(cellDecoration).pixmap(m_tableLayout.m_iconSize);
    }
    qreal height = pix.height();
    QImage img;
    if (pix.isNull()) {
        img = qvariant_cast<QImage>(cellDecoration);
        if (img.isNull())
            return;
        height = img.height();
    }

    // Now either img or pix is set.

    // Apply scaling factor
    if (m_tableLayout.scalingFactor() != 1.) {
        if (!pix.isNull()) {
            pix = pix.scaledToWidth(qRound(pix.width() * m_tableLayout.scalingFactor()));
            height = pix.height();
        } else {
            img = img.scaledToWidth(qRound(img.width() * m_tableLayout.scalingFactor()));
            height = img.height();
        }
    }

    // Vertical centering
    const int y = qMax(0, int((cellContentsRect.height() - height) / 2.0));
    const QPoint topLeft = cellContentsRect.topLeft().toPoint() + QPoint(0, y);
    if (!img.isNull()) {
        // Draw img
        painter.drawImage(topLeft, img);
    } else {
        // Draw pix
        painter.drawPixmap(topLeft, pix);
    }
}